

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

CharSetNode * __thiscall
UnifiedRegex::CharSetLeaf::UnionInPlace
          (CharSetLeaf *this,ArenaAllocator *allocator,uint level,CharSetNode *other)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  long lVar5;
  uint uVar6;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2f9,"(level == 0)","level == 0");
    if (!bVar2) goto LAB_00e5aa57;
    *puVar4 = 0;
  }
  if (other != (CharSetNode *)0x0) {
    iVar3 = (*other->_vptr_CharSetNode[0xd])(other);
    if ((char)iVar3 != '\0') goto LAB_00e5aa0e;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                     ,0x2fa,"(other != nullptr && other->IsLeaf())",
                     "other != nullptr && other->IsLeaf()");
  if (!bVar2) {
LAB_00e5aa57:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00e5aa0e:
  bVar2 = true;
  lVar5 = 2;
  do {
    uVar6 = (this->vec).vec[lVar5 + -2] | *(uint *)((long)&other->_vptr_CharSetNode + lVar5 * 4);
    (this->vec).vec[lVar5 + -2] = uVar6;
    bVar2 = (bool)(bVar2 & uVar6 == 0xffffffff);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  if (bVar2) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
               this,0x28);
    this = (CharSetLeaf *)&CharSetFull::Instance;
  }
  return &this->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetLeaf::UnionInPlace(ArenaAllocator* allocator, uint level, const CharSetNode* other)
    {
        Assert(level == 0);
        Assert(other != nullptr && other->IsLeaf());
        CharSetLeaf* otherLeaf = (CharSetLeaf*)other;
        if (vec.UnionInPlaceFullCheck(otherLeaf->vec))
        {
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }